

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.hpp
# Opt level: O0

void qclab::dense::operateInPlace<qclab::dense::SquareMatrix<double>>(Op op,SquareMatrix<double> *A)

{
  int64_t iVar1;
  int64_t iVar2;
  double *__a;
  double *__b;
  undefined8 local_38;
  int64_t i;
  int64_t j;
  int64_t cols;
  int64_t rows;
  SquareMatrix<double> *A_local;
  Op op_local;
  
  if (op != NoTrans) {
    iVar1 = SquareMatrix<double>::rows(A);
    iVar2 = SquareMatrix<double>::cols(A);
    for (i = 0; local_38 = i, i < iVar2 + -1; i = i + 1) {
      while (local_38 = local_38 + 1, local_38 < iVar1) {
        __a = SquareMatrix<double>::operator()(A,local_38,i);
        __b = SquareMatrix<double>::operator()(A,i,local_38);
        std::swap<double>(__a,__b);
      }
    }
  }
  return;
}

Assistant:

void operateInPlace( Op op , T& A ) {
      if ( op == Op::NoTrans ) return ;
      const int64_t rows = A.rows() ;
      const int64_t cols = A.cols() ;
      if constexpr ( qclab::is_complex_v< typename T::value_type > ) {
        if ( op == Op::ConjTrans ) {
          // conjugate
          #pragma omp parallel for
          for ( int64_t j = 0; j < cols; j++ ) {
            for ( int64_t i = 0; i < rows; i++ ) {
              A(i,j) = std::conj( A(i,j) ) ;
            }
          }
        }
      }
      // transpose
      #pragma omp parallel for
      for ( int64_t j = 0; j < cols - 1; j++ ) {
        for ( int64_t i = j + 1; i < rows; i++ ) {
          std::swap( A(i,j) , A(j,i) ) ;
        }
      }
    }